

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O0

int Saig_ManBmcCountRefed(Aig_Man_t *p,Vec_Ptr_t *vSuper)

{
  int iVar1;
  Aig_Obj_t *p_00;
  int local_28;
  int local_24;
  int Counter;
  int i;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vSuper_local;
  Aig_Man_t *p_local;
  
  local_28 = 0;
  local_24 = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(vSuper);
    if (iVar1 <= local_24) {
      return local_28;
    }
    p_00 = (Aig_Obj_t *)Vec_PtrEntry(vSuper,local_24);
    iVar1 = Aig_IsComplement(p_00);
    if (iVar1 != 0) break;
    iVar1 = Aig_ObjRefs(p_00);
    local_28 = (uint)(1 < iVar1) + local_28;
    local_24 = local_24 + 1;
  }
  __assert_fail("!Aig_IsComplement(pObj)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcBmc3.c"
                ,0x21a,"int Saig_ManBmcCountRefed(Aig_Man_t *, Vec_Ptr_t *)");
}

Assistant:

int Saig_ManBmcCountRefed( Aig_Man_t * p, Vec_Ptr_t * vSuper )
{
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    Vec_PtrForEachEntry( Aig_Obj_t *, vSuper, pObj, i )
    {
        assert( !Aig_IsComplement(pObj) );
        Counter += (Aig_ObjRefs(pObj) > 1);
    }
    return Counter;
}